

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O1

ssize_t __thiscall
jaegertracing::thrift::BaggageRestrictionManager_getBaggageRestrictions_presult::read
          (BaggageRestrictionManager_getBaggageRestrictions_presult *this,int __fd,void *__buf,
          size_t __nbytes)

{
  vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
  *pvVar1;
  pointer pBVar2;
  pointer pBVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  long lVar8;
  pointer pBVar9;
  uint32_t _size8;
  int16_t fid;
  TType ftype;
  string fname;
  TType _etype11;
  uint local_6c;
  short local_66;
  int local_64;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  pointer local_40;
  undefined1 local_34 [4];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  iVar4 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_60);
  do {
    iVar5 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_60,&local_64,&local_66);
    iVar5 = iVar5 + iVar4;
    if (local_64 == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar5);
    }
    if (local_66 == 0) {
      if (local_64 != 0xf) {
        iVar6 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
        goto LAB_001f5117;
      }
      pvVar1 = this->success;
      pBVar9 = (pvVar1->
               super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pBVar2 = (pvVar1->
               super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pBVar3 = pBVar9;
      if (pBVar2 != pBVar9) {
        do {
          local_40 = pBVar3;
          (*(code *)**(undefined8 **)pBVar9)(pBVar9);
          pBVar9 = pBVar9 + 1;
          pBVar3 = local_40;
        } while (pBVar9 != pBVar2);
        (pvVar1->
        super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
        )._M_impl.super__Vector_impl_data._M_finish = local_40;
      }
      iVar4 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_34,&local_6c);
      std::
      vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
      ::resize(this->success,(ulong)local_6c);
      iVar4 = iVar4 + iVar5;
      if (local_6c != 0) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          pBVar9 = (this->success->
                   super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar5 = (**(code **)(*(long *)(&pBVar9->field_0x0 + lVar8) + 0x10))
                            (&pBVar9->field_0x0 + lVar8,this_00);
          iVar4 = iVar4 + iVar5;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x30;
        } while (uVar7 < local_6c);
      }
      iVar6 = (*this_00->_vptr_TProtocol[0x20])(this_00);
      iVar6 = iVar6 + iVar4;
      this->__isset =
           (_BaggageRestrictionManager_getBaggageRestrictions_presult__isset)
           ((byte)this->__isset | 1);
    }
    else {
      iVar6 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_001f5117:
      iVar6 = iVar6 + iVar5;
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar4 = iVar4 + iVar6;
  } while( true );
}

Assistant:

uint32_t BaggageRestrictionManager_getBaggageRestrictions_presult::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            (*(this->success)).clear();
            uint32_t _size8;
            ::apache::thrift::protocol::TType _etype11;
            xfer += iprot->readListBegin(_etype11, _size8);
            (*(this->success)).resize(_size8);
            uint32_t _i12;
            for (_i12 = 0; _i12 < _size8; ++_i12)
            {
              xfer += (*(this->success))[_i12].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}